

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3EvalPhraseMergeToken(Fts3Table *pTab,Fts3Phrase *p,int iToken,char *pList,int nList)

{
  int local_4c;
  int local_48;
  int nDiff;
  int nRight;
  int nLeft;
  char *pRight;
  char *pLeft;
  int rc;
  int nList_local;
  char *pList_local;
  Fts3Phrase *pFStack_18;
  int iToken_local;
  Fts3Phrase *p_local;
  Fts3Table *pTab_local;
  
  pLeft._0_4_ = 0;
  pLeft._4_4_ = nList;
  _rc = pList;
  pList_local._4_4_ = iToken;
  pFStack_18 = p;
  p_local = (Fts3Phrase *)pTab;
  if (pList == (char *)0x0) {
    sqlite3_free((p->doclist).aAll);
    (pFStack_18->doclist).aAll = (char *)0x0;
    (pFStack_18->doclist).nAll = 0;
  }
  else if (p->iDoclistToken < 0) {
    (p->doclist).aAll = pList;
    (p->doclist).nAll = nList;
  }
  else if ((p->doclist).aAll == (char *)0x0) {
    sqlite3_free(pList);
  }
  else {
    if (p->iDoclistToken < iToken) {
      pRight = (p->doclist).aAll;
      nDiff = (p->doclist).nAll;
      local_4c = iToken - p->iDoclistToken;
      local_48 = nList;
      _nRight = pList;
    }
    else {
      _nRight = (p->doclist).aAll;
      local_48 = (p->doclist).nAll;
      local_4c = p->iDoclistToken - iToken;
      nDiff = nList;
      pRight = pList;
    }
    pLeft._0_4_ = fts3DoclistPhraseMerge
                            ((uint)pTab->bDescIdx,local_4c,pRight,nDiff,(char **)&nRight,&local_48);
    sqlite3_free(pRight);
    (pFStack_18->doclist).aAll = _nRight;
    (pFStack_18->doclist).nAll = local_48;
  }
  if (pFStack_18->iDoclistToken < pList_local._4_4_) {
    pFStack_18->iDoclistToken = pList_local._4_4_;
  }
  return (int)pLeft;
}

Assistant:

static int fts3EvalPhraseMergeToken(
  Fts3Table *pTab,                /* FTS Table pointer */
  Fts3Phrase *p,                  /* Phrase to merge pList/nList into */
  int iToken,                     /* Token pList/nList corresponds to */
  char *pList,                    /* Pointer to doclist */
  int nList                       /* Number of bytes in pList */
){
  int rc = SQLITE_OK;
  assert( iToken!=p->iDoclistToken );

  if( pList==0 ){
    sqlite3_free(p->doclist.aAll);
    p->doclist.aAll = 0;
    p->doclist.nAll = 0;
  }

  else if( p->iDoclistToken<0 ){
    p->doclist.aAll = pList;
    p->doclist.nAll = nList;
  }

  else if( p->doclist.aAll==0 ){
    sqlite3_free(pList);
  }

  else {
    char *pLeft;
    char *pRight;
    int nLeft;
    int nRight;
    int nDiff;

    if( p->iDoclistToken<iToken ){
      pLeft = p->doclist.aAll;
      nLeft = p->doclist.nAll;
      pRight = pList;
      nRight = nList;
      nDiff = iToken - p->iDoclistToken;
    }else{
      pRight = p->doclist.aAll;
      nRight = p->doclist.nAll;
      pLeft = pList;
      nLeft = nList;
      nDiff = p->iDoclistToken - iToken;
    }

    rc = fts3DoclistPhraseMerge(
        pTab->bDescIdx, nDiff, pLeft, nLeft, &pRight, &nRight
    );
    sqlite3_free(pLeft);
    p->doclist.aAll = pRight;
    p->doclist.nAll = nRight;
  }

  if( iToken>p->iDoclistToken ) p->iDoclistToken = iToken;
  return rc;
}